

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

int Lpk_ExploreCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,Kit_DsdNtk_t *pNtk)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  Kit_DsdObj_t *pKVar6;
  If_Obj_t *pIVar7;
  Abc_Obj_t *pAVar8;
  abctime aVar9;
  abctime aVar10;
  void *pvVar11;
  If_Man_t *p_00;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  If_Obj_t *ppLeaves [16];
  
  pKVar6 = Kit_DsdNtkRoot(pNtk);
  uVar4 = (uint)*pKVar6 >> 6 & 7;
  if (uVar4 - 3 < 3) {
    p_00 = p->pIfMan;
    if (p_00 == (If_Man_t *)0x0) {
      Lpk_IfManStart(p);
      p_00 = p->pIfMan;
    }
    If_ManRestart(p_00);
    for (lVar13 = 0; lVar13 < p->pPars->nVarsMax; lVar13 = lVar13 + 1) {
      pIVar7 = If_ManCreateCi(p->pIfMan);
      ppLeaves[lVar13] = pIVar7;
    }
    for (uVar14 = 0; uVar14 < (*(uint *)pCut & 0x3f); uVar14 = uVar14 + 1) {
      pAVar8 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar14]);
      p->pIfMan->pPars->pTimesArr[uVar14] = (float)(*(uint *)&pAVar8->field_0x14 >> 0xc);
    }
    If_ManSetupCiCutSets(p->pIfMan);
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    pIVar7 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)pNtk->Root,(If_Obj_t *)0x0);
    if (pIVar7 == (If_Obj_t *)0x0) {
      return 0;
    }
    If_ManCreateCo(p->pIfMan,(If_Obj_t *)((ulong)pIVar7 & 0xfffffffffffffffe));
    p->pIfMan->pPars->fAreaOnly = 1;
    aVar9 = Abc_Clock();
    If_ManPerformMappingComb(p->pIfMan);
    aVar10 = Abc_Clock();
    p->timeMap = p->timeMap + (aVar10 - aVar9);
    uVar4 = (*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f);
    uVar15 = (uint)p->pIfMan->AreaGlo;
    uVar12 = uVar4 - uVar15;
    if (p->pPars->fVeryVerbose != 0) {
      printf("       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n",
             (ulong)uVar4,(ulong)uVar15,(ulong)uVar12,
             (ulong)((int)p->pIfMan->RequiredGlo - (*(uint *)&p->pObj->field_0x14 >> 0xc)),
             (ulong)(uint)p->nCalledSRed);
    }
    if ((int)uVar12 < 1) {
      if (p->pPars->fZeroCost == 0) {
        return 0;
      }
      if (uVar4 != uVar15) {
        return 0;
      }
    }
    fVar1 = p->pIfMan->RequiredGlo;
    iVar5 = Abc_ObjRequiredLevel(p->pObj);
    if (iVar5 < (int)fVar1) {
      return 0;
    }
    uVar2 = p->nGainTotal;
    uVar3 = p->nChanges;
    p->nGainTotal = uVar12 + uVar2;
    p->nChanges = uVar3 + 1;
    if (p->nCalledSRed != 0) {
      p->nBenefited = p->nBenefited + 1;
    }
    If_ManCleanNodeCopy(p->pIfMan);
    If_ManCleanCutData(p->pIfMan);
    for (uVar14 = 0; uVar14 < (*(uint *)pCut & 0x3f); uVar14 = uVar14 + 1) {
      pAVar8 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar14]);
      pvVar11 = Vec_PtrEntry(p->pIfMan->vCis,(int)uVar14);
      *(Abc_Obj_t **)((long)pvVar11 + 0x40) = pAVar8;
    }
    pAVar8 = Abc_NodeFromIf_rec(p->pNtk,p->pIfMan,(If_Obj_t *)((ulong)pIVar7 & 0xfffffffffffffffe),
                                p->vCover);
    (pAVar8->field_5).pData = (void *)((ulong)(pAVar8->field_5).pData ^ (ulong)((uint)pIVar7 & 1));
    Abc_NtkUpdate(p->pObj,pAVar8,p->vLevels);
  }
  else {
    if (uVar4 == 2) {
      pAVar8 = Abc_NtkObj(p->pNtk,*(int *)((long)pCut->pLeaves +
                                          (ulong)(*(ushort *)(pKVar6 + 1) & 0xfffffffe) * 2));
      if (((*(ushort *)(pKVar6 + 1) ^ pNtk->Root) & 1) != 0) {
        pAVar8 = Abc_NtkCreateNodeInv(p->pNtk,pAVar8);
      }
    }
    else {
      if (uVar4 != 1) {
        __assert_fail("pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCore.c"
                      ,0xa1,"int Lpk_ExploreCut(Lpk_Man_t *, Lpk_Cut_t *, Kit_DsdNtk_t *)");
      }
      if ((pNtk->Root & 1) == 0) {
        pAVar8 = Abc_NtkCreateNodeConst1(p->pNtk);
      }
      else {
        pAVar8 = Abc_NtkCreateNodeConst0(p->pNtk);
      }
    }
    Abc_NtkUpdate(p->pObj,pAVar8,p->vLevels);
    p->nGainTotal = (p->nGainTotal - (*(uint *)pCut >> 0xc & 0x3f)) + (*(uint *)pCut >> 6 & 0x3f);
  }
  return 1;
}

Assistant:

int Lpk_ExploreCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, Kit_DsdNtk_t * pNtk )
{
    extern Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover );
    Kit_DsdObj_t * pRoot;
    If_Obj_t * pDriver, * ppLeaves[16];
    Abc_Obj_t * pLeaf, * pObjNew;
    int nGain, i;
    abctime clk;
    int nNodesBef;
//    int nOldShared;

    // check special cases
    pRoot = Kit_DsdNtkRoot( pNtk );
    if ( pRoot->Type == KIT_DSD_CONST1 )
    {
        if ( Abc_LitIsCompl(pNtk->Root) )
            pObjNew = Abc_NtkCreateNodeConst0( p->pNtk );
        else
            pObjNew = Abc_NtkCreateNodeConst1( p->pNtk );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    if ( pRoot->Type == KIT_DSD_VAR )
    {
        pObjNew = Abc_NtkObj( p->pNtk, pCut->pLeaves[ Abc_Lit2Var(pRoot->pFans[0]) ] );
        if ( Abc_LitIsCompl(pNtk->Root) ^ Abc_LitIsCompl(pRoot->pFans[0]) )
            pObjNew = Abc_NtkCreateNodeInv( p->pNtk, pObjNew );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    assert( pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME );

    // start the mapping manager
    if ( p->pIfMan == NULL )
        Lpk_IfManStart( p );

    // prepare the mapping manager
    If_ManRestart( p->pIfMan );
    // create the PI variables
    for ( i = 0; i < p->pPars->nVarsMax; i++ )
        ppLeaves[i] = If_ManCreateCi( p->pIfMan );
    // set the arrival times
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        p->pIfMan->pPars->pTimesArr[i] = (float)pLeaf->Level;
    // prepare the PI cuts
    If_ManSetupCiCutSets( p->pIfMan );
    // create the internal nodes
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    pDriver = Lpk_MapTree_rec( p, pNtk, ppLeaves, pNtk->Root, NULL );
    if ( pDriver == NULL )
        return 0;
    // create the PO node
    If_ManCreateCo( p->pIfMan, If_Regular(pDriver) );

    // perform mapping
    p->pIfMan->pPars->fAreaOnly = 1;
clk = Abc_Clock();
    If_ManPerformMappingComb( p->pIfMan );
p->timeMap += Abc_Clock() - clk;

    // compute the gain in area
    nGain = pCut->nNodes - pCut->nNodesDup - (int)p->pIfMan->AreaGlo;
    if ( p->pPars->fVeryVerbose )
        printf( "       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n", 
            pCut->nNodes - pCut->nNodesDup, (int)p->pIfMan->AreaGlo, nGain, (int)p->pIfMan->RequiredGlo - (int)p->pObj->Level, p->nCalledSRed );

    // quit if there is no gain
    if ( !(nGain > 0 || (p->pPars->fZeroCost && nGain == 0)) )
        return 0;

    // quit if depth increases too much
    if ( (int)p->pIfMan->RequiredGlo > Abc_ObjRequiredLevel(p->pObj) )
        return 0;

    // perform replacement
    p->nGainTotal += nGain;
    p->nChanges++;
    if ( p->nCalledSRed )
        p->nBenefited++;

    nNodesBef = Abc_NtkNodeNum(p->pNtk);
    // prepare the mapping manager
    If_ManCleanNodeCopy( p->pIfMan );
    If_ManCleanCutData( p->pIfMan );
    // set the PIs of the cut
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        If_ObjSetCopy( If_ManCi(p->pIfMan, i), pLeaf );
    // get the area of mapping
    pObjNew = Abc_NodeFromIf_rec( p->pNtk, p->pIfMan, If_Regular(pDriver), p->vCover );
    pObjNew->pData = Hop_NotCond( (Hop_Obj_t *)pObjNew->pData, If_IsComplement(pDriver) );
    // perform replacement
    Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
    return 1;
}